

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.h
# Opt level: O3

int numroots(int np,poly *sseq,int *atneg,int *atpos,bool non_neg)

{
  int *piVar1;
  double *pdVar2;
  int iVar3;
  poly *ppVar4;
  int iVar5;
  poly *ppVar6;
  double dVar7;
  double dVar8;
  
  if (np < 1) {
    iVar5 = 0;
    iVar3 = 0;
    if (!non_neg) goto LAB_0015e2d7;
  }
  else {
    dVar7 = sseq->coef[sseq->ord];
    ppVar4 = sseq + 1;
    iVar5 = 0;
    ppVar6 = ppVar4;
    dVar8 = dVar7;
    do {
      piVar1 = &ppVar6->ord;
      pdVar2 = ppVar6->coef;
      iVar5 = iVar5 + (uint)(dVar8 * pdVar2[*piVar1] < 0.0 || dVar8 == 0.0);
      ppVar6 = ppVar6 + 1;
      dVar8 = pdVar2[*piVar1];
    } while (ppVar6 <= sseq + np);
    if (!non_neg) {
      if (np < 1) {
        iVar3 = 0;
      }
      else {
        if (((long)sseq->ord & 1U) != 0) {
          dVar7 = -dVar7;
        }
        iVar3 = 0;
        do {
          dVar8 = ppVar4->coef[ppVar4->ord];
          if (((long)ppVar4->ord & 1U) != 0) {
            dVar8 = -dVar8;
          }
          iVar3 = iVar3 + (uint)(dVar7 == 0.0 || dVar7 * dVar8 < 0.0);
          ppVar4 = ppVar4 + 1;
          dVar7 = dVar8;
        } while (ppVar4 <= sseq + np);
      }
      goto LAB_0015e2d7;
    }
  }
  iVar3 = numchanges(np,sseq,0.0);
LAB_0015e2d7:
  *atneg = iVar3;
  *atpos = iVar5;
  return iVar3 - iVar5;
}

Assistant:

int numroots(int np, poly *sseq, int *atneg, int *atpos, bool non_neg)
{
	int atposinf = 0;
	int atneginf = 0;

	/* changes at positive infinity */
	double f;
	double lf = sseq[0].coef[sseq[0].ord];

	poly *s;
	for (s = sseq + 1; s <= sseq + np; s++) {
		f = s->coef[s->ord];
		if (lf == 0.0 || lf * f < 0)
			atposinf++;
		lf = f;
	}

	// changes at negative infinity or zero
	if (non_neg)
		atneginf = numchanges(np, sseq, 0.0);

	else
	{
		if (sseq[0].ord & 1)
			lf = -sseq[0].coef[sseq[0].ord];
		else
			lf = sseq[0].coef[sseq[0].ord];

		for (s = sseq + 1; s <= sseq + np; s++) {
			if (s->ord & 1)
				f = -s->coef[s->ord];
			else
				f = s->coef[s->ord];
			if (lf == 0.0 || lf * f < 0)
				atneginf++;
			lf = f;
		}
	}

	*atneg = atneginf;
	*atpos = atposinf;

	return(atneginf - atposinf);
}